

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O1

void __thiscall leveldb::Block::Block(Block *this,BlockContents *contents)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = (contents->data).data_;
  this->data_ = pcVar2;
  uVar3 = (contents->data).size_;
  this->size_ = uVar3;
  this->owned_ = contents->heap_allocated;
  if ((3 < uVar3) && (uVar1 = *(uint *)(pcVar2 + (uVar3 - 4)), (ulong)uVar1 <= uVar3 - 4 >> 2)) {
    this->restart_offset_ = ((int)uVar3 + uVar1 * -4) - 4;
    return;
  }
  this->size_ = 0;
  return;
}

Assistant:

const char* data() const { return data_; }